

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

void __thiscall
obs::signal<void(int,int,double)>::operator()
          (signal<void(int,int,double)> *this,int *args,int *args_1,double *args_2)

{
  bool bVar1;
  iterator __begin0;
  iterator __end0;
  iterator iStack_78;
  iterator local_50;
  
  safe_list<obs::slot<void_(int,_int,_double)>_>::begin
            (&iStack_78,(safe_list<obs::slot<void_(int,_int,_double)>_> *)(this + 8));
  safe_list<obs::slot<void_(int,_int,_double)>_>::end
            (&local_50,(safe_list<obs::slot<void_(int,_int,_double)>_> *)(this + 8));
  while( true ) {
    bVar1 = safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::operator!=
                      (&iStack_78,&local_50);
    if (!bVar1) {
      safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::~iterator(&local_50);
      safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::~iterator(&iStack_78);
      return;
    }
    if ((iStack_78.m_node == (node *)0x0) || (iStack_78.m_locked == false)) break;
    if (iStack_78.m_value != (slot<void_(int,_int,_double)> *)0x0) {
      slot<void(int,int,double)>::operator()
                ((slot<void(int,int,double)> *)iStack_78.m_value,args,args_1,args_2);
    }
    safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::operator++(&iStack_78);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,
                "T *obs::safe_list<obs::slot<void (int, int, double)>>::iterator::operator*() const [T = obs::slot<void (int, int, double)>]"
               );
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }